

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4afdb9::Db::parseSimpleId(Db *this)

{
  NameWithTemplateArgs *pNVar1;
  NameState *in_RSI;
  Node *TA;
  Node *SN;
  Node *local_20;
  NameWithTemplateArgs *local_18;
  
  local_18 = (NameWithTemplateArgs *)parseSourceName(this,in_RSI);
  if (local_18 == (NameWithTemplateArgs *)0x0) {
    pNVar1 = (NameWithTemplateArgs *)0x0;
  }
  else {
    pNVar1 = local_18;
    if ((this->Last != this->First) && (*this->First == 'I')) {
      pNVar1 = (NameWithTemplateArgs *)0x0;
      local_20 = parseTemplateArgs(this,false);
      if (local_20 != (Node *)0x0) {
        pNVar1 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                           ((Db *)this,(Node **)&local_18,&local_20);
      }
    }
  }
  return &pNVar1->super_Node;
}

Assistant:

Node *Db::parseSimpleId() {
  Node *SN = parseSourceName(/*NameState=*/nullptr);
  if (SN == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(SN, TA);
  }
  return SN;
}